

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void __thiscall
andres::marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long*>
          (Geometry<std::allocator<unsigned_long>> *this,unsigned_long *begin,unsigned_long *end,
          CoordinateOrder *externalCoordinateOrder,CoordinateOrder *internalCoordinateOrder,
          allocator_type *allocator)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  CoordinateOrder CVar3;
  CoordinateOrder CVar4;
  unsigned_long uVar5;
  unsigned_long *puVar6;
  runtime_error *this_00;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  unsigned_long *puVar11;
  size_t j;
  ulong uVar12;
  
  lVar8 = (long)end - (long)begin >> 3;
  puVar6 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                     ((new_allocator<unsigned_long> *)this,lVar8 * 3,(void *)0x0);
  *(unsigned_long **)(this + 8) = puVar6;
  lVar7 = (long)end - (long)begin;
  puVar1 = (undefined8 *)((long)puVar6 + lVar7);
  *(undefined8 **)(this + 0x10) = puVar1;
  puVar2 = (undefined8 *)(lVar7 + (long)puVar1);
  *(undefined8 **)(this + 0x18) = puVar2;
  *(long *)(this + 0x20) = lVar8;
  *(undefined8 *)(this + 0x28) = 1;
  CVar3 = *internalCoordinateOrder;
  *(CoordinateOrder *)(this + 0x30) = CVar3;
  this[0x34] = (Geometry<std::allocator<unsigned_long>>)0x1;
  if (lVar7 == 0) {
    return;
  }
  CVar4 = *externalCoordinateOrder;
  this[0x34] = (Geometry<std::allocator<unsigned_long>>)(CVar4 == CVar3);
  uVar12 = 0;
  do {
    uVar5 = begin[uVar12];
    puVar6[uVar12] = uVar5;
    *(unsigned_long *)(this + 0x28) = uVar5 * *(long *)(this + 0x28);
    uVar12 = uVar12 + 1;
    uVar9 = *(ulong *)(this + 0x20);
  } while (uVar12 < uVar9);
  if (uVar9 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else {
    if (CVar4 == FirstMajorOrder) {
      puVar2[uVar9 - 1] = 1;
      if (uVar9 != 1) {
        lVar8 = 1;
        do {
          lVar8 = lVar8 * puVar6[uVar9 - 1];
          *(long *)((long)puVar6 + uVar9 * 8 + (long)end * 2 + (long)begin * -2 + -0x10) = lVar8;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 1);
      }
    }
    else {
      *puVar2 = 1;
      if (uVar9 != 1) {
        lVar8 = uVar9 - 1;
        lVar10 = 1;
        puVar11 = puVar6;
        do {
          lVar10 = lVar10 * *puVar11;
          *(long *)((long)puVar11 + (long)end * 2 + (long)begin * -2 + 8) = lVar10;
          puVar11 = puVar11 + 1;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
    }
    lVar8 = *(long *)(this + 0x20);
    if (lVar8 != 0) {
      if (CVar3 == FirstMajorOrder) {
        puVar1[lVar8 + -1] = 1;
        if (lVar8 == 1) {
          return;
        }
        lVar10 = 1;
        do {
          lVar10 = lVar10 * puVar6[lVar8 + -1];
          *(long *)((long)puVar6 + lVar8 * 8 + lVar7 + -0x10) = lVar10;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 1);
        return;
      }
      *puVar1 = 1;
      if (lVar8 == 1) {
        return;
      }
      lVar8 = lVar8 + -1;
      lVar10 = 1;
      do {
        lVar10 = lVar10 * *puVar6;
        *(long *)((long)puVar6 + lVar7 + 8) = lVar10;
        puVar6 = puVar6 + 1;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline 
Geometry<A>::Geometry
(
    ShapeIterator begin, 
    ShapeIterator end,
    const CoordinateOrder& externalCoordinateOrder,
    const CoordinateOrder& internalCoordinateOrder,
    const typename Geometry<A>::allocator_type& allocator
)
: allocator_(allocator),
  shape_(allocator_.allocate(std::distance(begin, end) * 3)), 
  shapeStrides_(shape_ + std::distance(begin, end)),
  strides_(shapeStrides_ + std::distance(begin, end)), 
  dimension_(std::distance(begin, end)),
  size_(1),
  coordinateOrder_(internalCoordinateOrder),
  isSimple_(true)
{
    if(dimension_ != 0) { // if the array is not a scalar
        isSimple_ = (externalCoordinateOrder == internalCoordinateOrder);
        for(std::size_t j=0; j<dimension(); ++j, ++begin) {
            const std::size_t s = static_cast<std::size_t>(*begin);
            shape(j) = s;
            size() *= s;
        }
        stridesFromShape(shapeBegin(), shapeEnd(), stridesBegin(), 
            externalCoordinateOrder);
        stridesFromShape(shapeBegin(), shapeEnd(), shapeStridesBegin(), 
            internalCoordinateOrder);
    }
}